

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sCompRow_to_CompCol(int m,int n,int_t nnz,float *a,int_t *colind,int_t *rowptr,float **at,
                        int_t **rowind,int_t **colptr)

{
  int iVar1;
  int iVar2;
  int_t *piVar3;
  float *pfVar4;
  int_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  pfVar4 = floatMalloc((long)nnz);
  *at = pfVar4;
  piVar5 = intMalloc(nnz);
  *rowind = piVar5;
  piVar5 = intMalloc(n + 1);
  *colptr = piVar5;
  piVar5 = intCalloc(n);
  if (0 < m) {
    uVar7 = 0;
    do {
      lVar8 = (long)rowptr[uVar7];
      uVar6 = uVar7 + 1;
      if (rowptr[uVar7] < rowptr[uVar7 + 1]) {
        do {
          piVar5[colind[lVar8]] = piVar5[colind[lVar8]] + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < rowptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != (uint)m);
  }
  piVar3 = *colptr;
  *piVar3 = 0;
  if (0 < n) {
    uVar7 = 0;
    do {
      piVar3[uVar7 + 1] = piVar5[uVar7] + piVar3[uVar7];
      piVar5[uVar7] = piVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
  }
  if (0 < m) {
    uVar7 = 0;
    do {
      lVar8 = (long)rowptr[uVar7];
      uVar6 = uVar7 + 1;
      if (rowptr[uVar7] < rowptr[uVar7 + 1]) {
        piVar3 = *rowind;
        pfVar4 = *at;
        do {
          iVar1 = colind[lVar8];
          iVar2 = piVar5[iVar1];
          piVar3[iVar2] = (int_t)uVar7;
          pfVar4[iVar2] = a[lVar8];
          piVar5[iVar1] = piVar5[iVar1] + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < rowptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != (uint)m);
  }
  superlu_free(piVar5);
  return;
}

Assistant:

void
sCompRow_to_CompCol(int m, int n, int_t nnz, 
		    float *a, int_t *colind, int_t *rowptr,
		    float **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (float *) floatMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}